

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInitialNodeOrientation(ChElementShellReissner4 *this)

{
  ChVector<double> *v;
  undefined8 *puVar1;
  pointer psVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  ChVector<double> *xi;
  double *xi_00;
  ChVector<double> *extraout_RDX;
  double *extraout_RDX_00;
  double *xi_01;
  double *extraout_RDX_01;
  double *pdVar7;
  double *xi_02;
  double *extraout_RDX_02;
  ChMatrix33<double> *pCVar8;
  ChMatrix33<double> *this_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ChMatrix33<double> t123;
  long local_b8;
  double *local_b0;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  double local_78;
  undefined8 local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  undefined8 local_40;
  double local_38;
  
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  v = this->xa;
  lVar6 = 0;
  xi = v;
  do {
    lVar3 = *(long *)((long)&(psVar2->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar6);
    if (xi != (ChVector<double> *)(lVar3 + 0x20)) {
      xi->m_data[0] = *(double *)(lVar3 + 0x20);
      xi->m_data[1] = *(double *)(lVar3 + 0x28);
      xi->m_data[2] = *(double *)(lVar3 + 0x30);
    }
    xi = xi + 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  pCVar8 = this->iTa;
  lVar6 = 0;
  do {
    InterpDeriv_xi1(&local_90,v,xi->m_data);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_90.m_data[0];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_90.m_data[2];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_90.m_data[1] * local_90.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar35,auVar9,auVar9);
    auVar9 = vfmadd231sd_fma(auVar9,auVar50,auVar50);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar33 = 1.0 / auVar9._0_8_;
    dVar4 = local_90.m_data[0] * dVar33;
    dVar5 = local_90.m_data[1] * dVar33;
    dVar33 = local_90.m_data[2] * dVar33;
    InterpDeriv_xi2(&local_a8,v,xi_00);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_a8.m_data[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_a8.m_data[2];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar33;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar5;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar4;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_a8.m_data[1] * local_a8.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar36,auVar10,auVar10);
    auVar9 = vfmadd231sd_fma(auVar9,auVar51,auVar51);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_a8.m_data[2] * dVar34;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_a8.m_data[1] * dVar34 * dVar33;
    auVar10 = vfmsub231sd_fma(auVar52,auVar68,auVar37);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_a8.m_data[0] * dVar34;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar4 * local_a8.m_data[2] * dVar34;
    auVar9 = vfmsub231sd_fma(auVar38,auVar62,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_a8.m_data[0] * dVar34 * dVar5;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_a8.m_data[1] * dVar34;
    auVar11 = vfmsub231sd_fma(auVar12,auVar74,auVar24);
    local_50 = auVar9._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_50 * local_50;
    auVar9 = vfmadd231sd_fma(auVar25,auVar10,auVar10);
    auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    local_38 = auVar11._0_8_ * dVar34;
    local_68 = auVar10._0_8_ * dVar34;
    local_50 = local_50 * dVar34;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar5 * local_38;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_50;
    auVar9 = vfmsub231sd_fma(auVar26,auVar39,auVar62);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_68;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar4 * local_50;
    auVar10 = vfmsub231sd_fma(auVar69,auVar53,auVar68);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_38;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar33 * local_68;
    auVar11 = vfmsub231sd_fma(auVar63,auVar13,auVar74);
    local_70 = auVar9._0_8_;
    local_58 = auVar11._0_8_;
    local_40 = auVar10._0_8_;
    local_b8 = *(long *)((long)&(((this->m_nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar6) + 0x58;
    local_b0 = &local_78;
    local_78 = dVar4;
    local_60 = dVar5;
    local_48 = dVar33;
    ChMatrix33<double>::operator=
              (pCVar8,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_b8);
    pCVar8 = pCVar8 + 1;
    lVar6 = lVar6 + 0x10;
    xi = extraout_RDX;
  } while (lVar6 != 0x40);
  pCVar8 = this->iTa_i;
  lVar6 = 0x26e8;
  do {
    *(undefined8 *)((long)this + lVar6 + -0x40) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar6 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar6 + -0x28) = 0;
    *(undefined8 *)((long)this + lVar6 + -0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar6 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar6 + -8) = 0;
    *(undefined8 *)
     ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase + lVar6) = 0x3ff0000000000000;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x2808);
  this_00 = this->iTa_A;
  lVar6 = 0x2808;
  do {
    *(undefined8 *)((long)this + lVar6 + -0x40) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar6 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar6 + -0x28) = 0;
    *(undefined8 *)((long)this + lVar6 + -0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar6 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar6 + -8) = 0;
    *(undefined8 *)
     ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase + lVar6) = 0x3ff0000000000000;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x2928);
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  lVar6 = 0;
  pdVar7 = extraout_RDX_00;
  do {
    InterpDeriv_xi1(&local_90,v,pdVar7);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_90.m_data[0];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_90.m_data[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_90.m_data[1] * local_90.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar40,auVar14,auVar14);
    auVar9 = vfmadd231sd_fma(auVar9,auVar54,auVar54);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar33 = 1.0 / auVar9._0_8_;
    dVar4 = local_90.m_data[0] * dVar33;
    dVar5 = local_90.m_data[1] * dVar33;
    dVar33 = local_90.m_data[2] * dVar33;
    InterpDeriv_xi2(&local_a8,v,xi_01);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_a8.m_data[0];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_a8.m_data[2];
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar33;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar5;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar4;
    local_b8 = (long)(pCVar8 + 0x18) + 0x18;
    local_b0 = &local_78;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_a8.m_data[1] * local_a8.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar41,auVar15,auVar15);
    auVar9 = vfmadd231sd_fma(auVar9,auVar55,auVar55);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_a8.m_data[2] * dVar34;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_a8.m_data[1] * dVar34 * dVar33;
    auVar10 = vfmsub231sd_fma(auVar56,auVar70,auVar42);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_a8.m_data[0] * dVar34;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar4 * local_a8.m_data[2] * dVar34;
    auVar9 = vfmsub231sd_fma(auVar43,auVar64,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_a8.m_data[0] * dVar34 * dVar5;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_a8.m_data[1] * dVar34;
    auVar11 = vfmsub231sd_fma(auVar17,auVar75,auVar27);
    local_50 = auVar9._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_50 * local_50;
    auVar9 = vfmadd231sd_fma(auVar28,auVar10,auVar10);
    auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    local_38 = auVar11._0_8_ * dVar34;
    local_68 = auVar10._0_8_ * dVar34;
    local_50 = local_50 * dVar34;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar5 * local_38;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_50;
    auVar9 = vfmsub231sd_fma(auVar29,auVar44,auVar64);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_68;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar4 * local_50;
    auVar10 = vfmsub231sd_fma(auVar71,auVar57,auVar70);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_38;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar33 * local_68;
    auVar11 = vfmsub231sd_fma(auVar65,auVar18,auVar75);
    local_70 = auVar9._0_8_;
    local_58 = auVar11._0_8_;
    local_40 = auVar10._0_8_;
    local_78 = dVar4;
    local_60 = dVar5;
    local_48 = dVar33;
    ChMatrix33<double>::operator=
              (pCVar8,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_b8);
    pCVar8 = pCVar8 + 1;
    lVar6 = lVar6 + 0x10;
    pdVar7 = extraout_RDX_01;
  } while (lVar6 != 0x40);
  lVar6 = 0;
  do {
    InterpDeriv_xi1(&local_90,v,pdVar7);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_90.m_data[0];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_90.m_data[2];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_90.m_data[1] * local_90.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar45,auVar19,auVar19);
    auVar9 = vfmadd231sd_fma(auVar9,auVar58,auVar58);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar33 = 1.0 / auVar9._0_8_;
    dVar4 = local_90.m_data[0] * dVar33;
    dVar5 = local_90.m_data[1] * dVar33;
    dVar33 = local_90.m_data[2] * dVar33;
    InterpDeriv_xi2(&local_a8,v,xi_02);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_a8.m_data[0];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_a8.m_data[2];
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar33;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar5;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar4;
    local_b8 = (long)(this_00 + 0x18) + 0x18;
    local_b0 = &local_78;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_a8.m_data[1] * local_a8.m_data[1];
    auVar9 = vfmadd231sd_fma(auVar46,auVar20,auVar20);
    auVar9 = vfmadd231sd_fma(auVar9,auVar59,auVar59);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_a8.m_data[2] * dVar34;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_a8.m_data[1] * dVar34 * dVar33;
    auVar10 = vfmsub231sd_fma(auVar60,auVar72,auVar47);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_a8.m_data[0] * dVar34;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar4 * local_a8.m_data[2] * dVar34;
    auVar9 = vfmsub231sd_fma(auVar48,auVar66,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_a8.m_data[0] * dVar34 * dVar5;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_a8.m_data[1] * dVar34;
    auVar11 = vfmsub231sd_fma(auVar22,auVar76,auVar30);
    local_50 = auVar9._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_50 * local_50;
    auVar9 = vfmadd231sd_fma(auVar31,auVar10,auVar10);
    auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar34 = 1.0 / auVar9._0_8_;
    local_38 = auVar11._0_8_ * dVar34;
    local_68 = auVar10._0_8_ * dVar34;
    local_50 = local_50 * dVar34;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar5 * local_38;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_50;
    auVar9 = vfmsub231sd_fma(auVar32,auVar49,auVar66);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_68;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar4 * local_50;
    auVar10 = vfmsub231sd_fma(auVar73,auVar61,auVar72);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_38;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar33 * local_68;
    auVar11 = vfmsub231sd_fma(auVar67,auVar23,auVar76);
    local_70 = auVar9._0_8_;
    local_58 = auVar11._0_8_;
    local_40 = auVar10._0_8_;
    local_78 = dVar4;
    local_60 = dVar5;
    local_48 = dVar33;
    ChMatrix33<double>::operator=
              (this_00,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                        *)&local_b8);
    this_00 = this_00 + 1;
    lVar6 = lVar6 + 0x10;
    pdVar7 = extraout_RDX_02;
  } while (lVar6 != 0x40);
  InterpolateOrientation(this);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInitialNodeOrientation() {
    for (int i = 0; i < NUMNODES; i++) {
        xa[i] = this->m_nodes[i]->GetPos();
    }
    for (int i = 0; i < NUMNODES; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_n[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_n[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa[i] = m_nodes[i]->GetA().transpose() * t123;
    }
    for (int i = 0; i < NUMIP; i++) {
        iTa_i[i] = ChMatrix33<>(1);
    }
    for (int i = 0; i < NUMSSEP; i++) {
        iTa_A[i] = ChMatrix33<>(1);
    }
    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();
    for (int i = 0; i < NUMIP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_i[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_i[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_i[i] = T_i[i].transpose() * t123;
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_A[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_A[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_A[i] = T_A[i].transpose() * t123;
    }
    InterpolateOrientation();
}